

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O3

void __thiscall gl4cts::DirectStateAccess::TransformFeedback::BuffersTest::clean(BuffersTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_xfb_dsa != 0) {
    (**(code **)(lVar2 + 0x488))(1,&this->m_xfb_dsa);
    this->m_xfb_dsa = 0;
  }
  if (this->m_bo_a != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_a);
    this->m_bo_a = 0;
  }
  if (this->m_bo_b != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_b);
    this->m_bo_b = 0;
  }
  return;
}

Assistant:

void BuffersTest::clean()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release transform feedback object. */
	if (m_xfb_dsa)
	{
		gl.deleteTransformFeedbacks(1, &m_xfb_dsa);

		m_xfb_dsa = 0;
	}

	/* Release buffer objects. */
	if (m_bo_a)
	{
		gl.deleteBuffers(1, &m_bo_a);

		m_bo_a = 0;
	}

	if (m_bo_b)
	{
		gl.deleteBuffers(1, &m_bo_b);

		m_bo_b = 0;
	}
}